

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidationContextImpl.cpp
# Opt level: O2

bool __thiscall
xercesc_4_0::ValidationContextImpl::isPrefixUnknown(ValidationContextImpl *this,XMLCh *prefix)

{
  ElemStack *this_00;
  NamespaceScope *pNVar1;
  bool bVar2;
  uint uVar3;
  ulong in_RAX;
  byte bVar4;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  bVar2 = XMLString::equals(prefix,(XMLCh *)XMLUni::fgXMLNSString);
  bVar4 = 1;
  if (bVar2) goto LAB_002b994f;
  bVar2 = XMLString::equals(prefix,L"xml");
  if (!bVar2) {
    this_00 = this->fElemStack;
    if ((this_00 != (ElemStack *)0x0) && (this_00->fStackTop != 0)) {
      ElemStack::mapPrefixToURI(this_00,prefix,(bool *)((long)&uStack_18 + 7));
      bVar4 = uStack_18._7_1_;
      goto LAB_002b994f;
    }
    pNVar1 = this->fNamespaceScope;
    if (pNVar1 != (NamespaceScope *)0x0) {
      uVar3 = (**(pNVar1->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver)
                        (pNVar1,prefix);
      bVar4 = uVar3 == this->fNamespaceScope->fEmptyNamespaceId;
      goto LAB_002b994f;
    }
  }
  bVar4 = 0;
LAB_002b994f:
  return (bool)(bVar4 & 1);
}

Assistant:

bool ValidationContextImpl::isPrefixUnknown(XMLCh* prefix) {
    bool unknown = false;
    if (XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
        return true;
    }
    else if (!XMLString::equals(prefix, XMLUni::fgXMLString)) {
        if(fElemStack && !fElemStack->isEmpty())
            fElemStack->mapPrefixToURI(prefix, unknown);
        else if(fNamespaceScope)
            unknown = (fNamespaceScope->getNamespaceForPrefix(prefix)==fNamespaceScope->getEmptyNamespaceId());
    }
    return unknown;
}